

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_16.c
# Opt level: O3

parasail_result_t *
parasail_sw_table_diag_avx2_256_16
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int16_t iVar1;
  ushort uVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  short sVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  parasail_result_t *ppVar21;
  undefined1 (*ptr) [16];
  int16_t *ptr_00;
  int16_t *ptr_01;
  long lVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  int iVar29;
  uint uVar30;
  uint uVar31;
  undefined4 uVar32;
  ulong uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  int16_t iVar39;
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [64];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [64];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  uint local_3e0;
  uint local_3d8;
  uint local_3d0;
  uint local_3c8;
  uint local_3c0;
  uint local_3b8;
  uint local_3a0;
  uint local_398;
  uint local_390;
  int16_t *local_380;
  long local_348;
  long local_340;
  long local_338;
  long local_330;
  long local_328;
  long local_320;
  long local_318;
  long local_310;
  long local_308;
  long local_300;
  long local_2f8;
  long local_2f0;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  short local_1c0;
  short sStack_1be;
  short sStack_1bc;
  short sStack_1ba;
  short sStack_1b8;
  short sStack_1b6;
  short sStack_1b4;
  short sStack_1b2;
  short sStack_1b0;
  short sStack_1ae;
  short sStack_1ac;
  short sStack_1aa;
  short sStack_1a8;
  short sStack_1a6;
  short sStack_1a4;
  short sStack_1a2;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined2 local_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined2 uStack_138;
  undefined2 uStack_136;
  undefined2 uStack_134;
  undefined2 uStack_132;
  undefined2 uStack_130;
  undefined2 uStack_12e;
  undefined2 uStack_12c;
  undefined2 uStack_12a;
  undefined2 uStack_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 local_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined2 uStack_118;
  undefined2 uStack_116;
  undefined2 uStack_114;
  undefined2 uStack_112;
  undefined2 uStack_110;
  undefined2 uStack_10e;
  undefined2 uStack_10c;
  undefined2 uStack_10a;
  undefined2 uStack_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined1 local_100 [32];
  undefined2 local_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined2 uStack_d8;
  undefined2 uStack_d6;
  undefined2 uStack_d4;
  undefined2 uStack_d2;
  undefined2 uStack_d0;
  undefined2 uStack_ce;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  undefined2 uStack_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 local_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined2 uStack_b8;
  undefined2 uStack_b6;
  undefined2 uStack_b4;
  undefined2 uStack_b2;
  undefined2 uStack_b0;
  undefined2 uStack_ae;
  undefined2 uStack_ac;
  undefined2 uStack_aa;
  undefined2 uStack_a8;
  undefined2 uStack_a6;
  undefined2 uStack_a4;
  undefined2 uStack_a2;
  undefined2 local_a0;
  undefined2 uStack_9e;
  undefined2 uStack_9c;
  undefined2 uStack_9a;
  undefined2 uStack_98;
  undefined2 uStack_96;
  undefined2 uStack_94;
  undefined2 uStack_92;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined2 uStack_8c;
  undefined2 uStack_8a;
  undefined2 uStack_88;
  undefined2 uStack_86;
  undefined2 uStack_84;
  undefined2 uStack_82;
  undefined2 local_80;
  undefined2 uStack_7e;
  undefined2 uStack_7c;
  undefined2 uStack_7a;
  undefined2 uStack_78;
  undefined2 uStack_76;
  undefined2 uStack_74;
  undefined2 uStack_72;
  undefined2 uStack_70;
  undefined2 uStack_6e;
  undefined2 uStack_6c;
  undefined2 uStack_6a;
  undefined2 uStack_68;
  undefined2 uStack_66;
  undefined2 uStack_64;
  undefined2 uStack_62;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_table_diag_avx2_256_16_cold_7();
  }
  else if (s2Len < 1) {
    parasail_sw_table_diag_avx2_256_16_cold_6();
  }
  else if (open < 0) {
    parasail_sw_table_diag_avx2_256_16_cold_5();
  }
  else if (gap < 0) {
    parasail_sw_table_diag_avx2_256_16_cold_4();
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sw_table_diag_avx2_256_16_cold_3();
  }
  else {
    if (matrix->type == 0) {
      if (_s1 == (char *)0x0) {
        parasail_sw_table_diag_avx2_256_16_cold_2();
        return (parasail_result_t *)0x0;
      }
      uVar26 = (ulong)(uint)_s1Len;
      if (_s1Len < 1) {
        parasail_sw_table_diag_avx2_256_16_cold_1();
        return (parasail_result_t *)0x0;
      }
    }
    else {
      uVar26 = (ulong)(uint)matrix->length;
    }
    iVar20 = matrix->min;
    iVar24 = -iVar20;
    if (iVar20 != -open && SBORROW4(iVar20,-open) == iVar20 + open < 0) {
      iVar24 = open;
    }
    uVar28 = iVar24 - 0x7fff;
    sVar17 = 0x7ffe - (short)matrix->max;
    iVar39 = (int16_t)uVar28;
    local_160._2_2_ = iVar39;
    local_160._0_2_ = iVar39;
    local_160._4_2_ = iVar39;
    local_160._6_2_ = iVar39;
    local_160._8_2_ = iVar39;
    local_160._10_2_ = iVar39;
    local_160._12_2_ = iVar39;
    local_160._14_2_ = iVar39;
    local_160._16_2_ = iVar39;
    local_160._18_2_ = iVar39;
    local_160._20_2_ = iVar39;
    local_160._22_2_ = iVar39;
    local_160._24_2_ = iVar39;
    local_160._26_2_ = iVar39;
    local_160._28_2_ = iVar39;
    local_160._30_2_ = iVar39;
    local_1e0._2_2_ = iVar39;
    local_1e0._0_2_ = iVar39;
    local_1e0._4_2_ = iVar39;
    local_1e0._6_2_ = iVar39;
    local_1e0._8_2_ = iVar39;
    local_1e0._10_2_ = iVar39;
    local_1e0._12_2_ = iVar39;
    local_1e0._14_2_ = iVar39;
    local_1e0._16_2_ = iVar39;
    local_1e0._18_2_ = iVar39;
    local_1e0._20_2_ = iVar39;
    local_1e0._22_2_ = iVar39;
    local_1e0._24_2_ = iVar39;
    local_1e0._26_2_ = iVar39;
    local_1e0._28_2_ = iVar39;
    local_1e0._30_2_ = iVar39;
    local_200._2_2_ = iVar39;
    local_200._0_2_ = iVar39;
    local_200._4_2_ = iVar39;
    local_200._6_2_ = iVar39;
    local_200._8_2_ = iVar39;
    local_200._10_2_ = iVar39;
    local_200._12_2_ = iVar39;
    local_200._14_2_ = iVar39;
    local_200._16_2_ = iVar39;
    local_200._18_2_ = iVar39;
    local_200._20_2_ = iVar39;
    local_200._22_2_ = iVar39;
    local_200._24_2_ = iVar39;
    local_200._26_2_ = iVar39;
    local_200._28_2_ = iVar39;
    local_200._30_2_ = iVar39;
    uVar18 = (uint)uVar26;
    ppVar21 = parasail_result_new_table1(uVar18,s2Len);
    if (ppVar21 != (parasail_result_t *)0x0) {
      ppVar21->flag = ppVar21->flag | 0x10221004;
      uVar25 = (ulong)(s2Len + 0x1e);
      ptr = (undefined1 (*) [16])parasail_memalign_int16_t(0x20,uVar25);
      ptr_00 = parasail_memalign_int16_t(0x20,uVar25);
      ptr_01 = parasail_memalign_int16_t(0x20,uVar25);
      if (ptr_01 != (int16_t *)0x0 && (ptr_00 != (int16_t *)0x0 && ptr != (undefined1 (*) [16])0x0))
      {
        if (matrix->type == 0) {
          iVar20 = uVar18 + 0xf;
          local_380 = parasail_memalign_int16_t(0x20,(long)iVar20);
          if (local_380 == (int16_t *)0x0) {
            return (parasail_result_t *)0x0;
          }
          if (0 < (int)uVar18) {
            piVar3 = matrix->mapper;
            uVar25 = 0;
            do {
              local_380[uVar25] = (int16_t)piVar3[(byte)_s1[uVar25]];
              uVar25 = uVar25 + 1;
            } while (uVar26 != uVar25);
          }
          iVar24 = uVar18 + 1;
          if ((int)(uVar18 + 1) < iVar20) {
            iVar24 = iVar20;
          }
          memset(local_380 + (int)uVar18,0,(ulong)(~uVar18 + iVar24) * 2 + 2);
        }
        else {
          local_380 = (int16_t *)0x0;
        }
        uVar36 = s2Len + 0xf;
        auVar49._2_2_ = iVar39;
        auVar49._0_2_ = iVar39;
        auVar49._4_2_ = iVar39;
        auVar49._6_2_ = iVar39;
        auVar49._8_2_ = iVar39;
        auVar49._10_2_ = iVar39;
        auVar49._12_2_ = iVar39;
        auVar49._14_2_ = iVar39;
        auVar10._16_2_ = iVar39;
        auVar10._0_16_ = auVar49;
        auVar10._18_2_ = iVar39;
        auVar10._20_2_ = iVar39;
        auVar10._22_2_ = iVar39;
        auVar10._24_2_ = iVar39;
        auVar10._26_2_ = iVar39;
        auVar10._28_2_ = iVar39;
        auVar10._30_2_ = iVar39;
        auVar40 = vpslldq_avx2(ZEXT1632(auVar49),0xe);
        local_100 = vpblendw_avx2(auVar10,auVar40,0x80);
        local_80 = (undefined2)open;
        local_a0 = (undefined2)gap;
        local_120 = (undefined2)uVar26;
        local_c0 = (undefined2)s2Len;
        piVar3 = matrix->mapper;
        uVar27 = (ulong)(uint)s2Len;
        uVar25 = 0;
        do {
          *(short *)(ptr[1] + uVar25 * 2 + 0xe) = (short)piVar3[(byte)_s2[uVar25]];
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
        *(undefined1 (*) [16])(*ptr + 0xe) = (undefined1  [16])0x0;
        *ptr = (undefined1  [16])0x0;
        uVar31 = s2Len + 1U;
        if ((int)(s2Len + 1U) < (int)uVar36) {
          uVar31 = uVar36;
        }
        uVar25 = 0;
        local_1c0 = sVar17;
        sStack_1be = sVar17;
        sStack_1bc = sVar17;
        sStack_1ba = sVar17;
        sStack_1b8 = sVar17;
        sStack_1b6 = sVar17;
        sStack_1b4 = sVar17;
        sStack_1b2 = sVar17;
        sStack_1b0 = sVar17;
        sStack_1ae = sVar17;
        sStack_1ac = sVar17;
        sStack_1aa = sVar17;
        sStack_1a8 = sVar17;
        sStack_1a6 = sVar17;
        sStack_1a4 = sVar17;
        sStack_1a2 = sVar17;
        uStack_11e = local_120;
        uStack_11c = local_120;
        uStack_11a = local_120;
        uStack_118 = local_120;
        uStack_116 = local_120;
        uStack_114 = local_120;
        uStack_112 = local_120;
        uStack_110 = local_120;
        uStack_10e = local_120;
        uStack_10c = local_120;
        uStack_10a = local_120;
        uStack_108 = local_120;
        uStack_106 = local_120;
        uStack_104 = local_120;
        uStack_102 = local_120;
        uStack_be = local_c0;
        uStack_bc = local_c0;
        uStack_ba = local_c0;
        uStack_b8 = local_c0;
        uStack_b6 = local_c0;
        uStack_b4 = local_c0;
        uStack_b2 = local_c0;
        uStack_b0 = local_c0;
        uStack_ae = local_c0;
        uStack_ac = local_c0;
        uStack_aa = local_c0;
        uStack_a8 = local_c0;
        uStack_a6 = local_c0;
        uStack_a4 = local_c0;
        uStack_a2 = local_c0;
        uStack_9e = local_a0;
        uStack_9c = local_a0;
        uStack_9a = local_a0;
        uStack_98 = local_a0;
        uStack_96 = local_a0;
        uStack_94 = local_a0;
        uStack_92 = local_a0;
        uStack_90 = local_a0;
        uStack_8e = local_a0;
        uStack_8c = local_a0;
        uStack_8a = local_a0;
        uStack_88 = local_a0;
        uStack_86 = local_a0;
        uStack_84 = local_a0;
        uStack_82 = local_a0;
        uStack_7e = local_80;
        uStack_7c = local_80;
        uStack_7a = local_80;
        uStack_78 = local_80;
        uStack_76 = local_80;
        uStack_74 = local_80;
        uStack_72 = local_80;
        uStack_70 = local_80;
        uStack_6e = local_80;
        uStack_6c = local_80;
        uStack_6a = local_80;
        uStack_68 = local_80;
        uStack_66 = local_80;
        uStack_64 = local_80;
        uStack_62 = local_80;
        memset(ptr[1] + uVar27 * 2 + 0xe,0,(ulong)(~s2Len + uVar31) * 2 + 2);
        do {
          ptr_00[uVar25 + 0xf] = 0;
          ptr_01[uVar25 + 0xf] = iVar39;
          uVar25 = uVar25 + 1;
        } while (uVar27 != uVar25);
        lVar22 = 0;
        do {
          ptr_00[lVar22] = iVar39;
          ptr_01[lVar22] = iVar39;
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0xf);
        lVar22 = uVar27 + 0xf;
        do {
          ptr_00[lVar22] = iVar39;
          ptr_01[lVar22] = iVar39;
          lVar22 = lVar22 + 1;
          s2Len = s2Len + 1;
        } while (s2Len < (int)uVar36);
        if ((int)uVar18 < 1) {
          auVar40._2_2_ = iVar39;
          auVar40._0_2_ = iVar39;
          auVar40._4_2_ = iVar39;
          auVar40._6_2_ = iVar39;
          auVar40._8_2_ = iVar39;
          auVar40._10_2_ = iVar39;
          auVar40._12_2_ = iVar39;
          auVar40._14_2_ = iVar39;
          auVar40._16_2_ = iVar39;
          auVar40._18_2_ = iVar39;
          auVar40._20_2_ = iVar39;
          auVar40._22_2_ = iVar39;
          auVar40._24_2_ = iVar39;
          auVar40._26_2_ = iVar39;
          auVar40._28_2_ = iVar39;
          auVar40._30_2_ = iVar39;
          auVar44._2_2_ = sStack_1be;
          auVar44._0_2_ = local_1c0;
          auVar44._4_2_ = sStack_1bc;
          auVar44._6_2_ = sStack_1ba;
          auVar44._8_2_ = sStack_1b8;
          auVar44._10_2_ = sStack_1b6;
          auVar44._12_2_ = sStack_1b4;
          auVar44._14_2_ = sStack_1b2;
          auVar44._16_2_ = sStack_1b0;
          auVar44._18_2_ = sStack_1ae;
          auVar44._20_2_ = sStack_1ac;
          auVar44._22_2_ = sStack_1aa;
          auVar44._24_2_ = sStack_1a8;
          auVar44._26_2_ = sStack_1a6;
          auVar44._28_2_ = sStack_1a4;
          auVar44._30_2_ = sStack_1a2;
          local_1e0 = auVar40;
        }
        else {
          uVar25 = 1;
          if (1 < (int)uVar36) {
            uVar25 = (ulong)uVar36;
          }
          uVar18 = uVar18 - 1;
          auVar45 = ZEXT3264(local_160);
          auVar42 = ZEXT3264(local_200);
          local_2d0 = uVar27 * 0x3c + -0x3c;
          lVar22 = uVar27 * 0x40;
          local_2e8 = uVar27 * 0x38 + -0x38;
          local_2f0 = uVar27 * 0x34 + -0x34;
          local_2f8 = uVar27 * 0x18 + -0x18;
          local_300 = uVar27 * 0xc + -0xc;
          local_308 = uVar27 * 0x30 + -0x30;
          local_310 = uVar27 * 0x2c + -0x2c;
          local_318 = uVar27 * 0x20 + -0x20;
          local_320 = uVar27 * 0x24 + -0x24;
          local_328 = uVar27 * 0x1c + -0x1c;
          local_330 = uVar27 * 0x28 + -0x28;
          local_338 = uVar27 * 0x14 + -0x14;
          local_340 = uVar27 * 0x10 + -0x10;
          local_220._8_8_ = 0x80009000a000b;
          local_220._0_8_ = 0xc000d000e000f;
          local_220._16_8_ = 0x4000500060007;
          local_220._24_8_ = 0x100020003;
          local_e0 = 1;
          uStack_de = 1;
          uStack_dc = 1;
          uStack_da = 1;
          uStack_d8 = 1;
          uStack_d6 = 1;
          uStack_d4 = 1;
          uStack_d2 = 1;
          uStack_d0 = 1;
          uStack_ce = 1;
          uStack_cc = 1;
          uStack_ca = 1;
          uStack_c8 = 1;
          uStack_c6 = 1;
          uStack_c4 = 1;
          uStack_c2 = 1;
          local_140 = 0x10;
          uStack_13e = 0x10;
          uStack_13c = 0x10;
          uStack_13a = 0x10;
          uStack_138 = 0x10;
          uStack_136 = 0x10;
          uStack_134 = 0x10;
          uStack_132 = 0x10;
          uStack_130 = 0x10;
          uStack_12e = 0x10;
          uStack_12c = 0x10;
          uStack_12a = 0x10;
          uStack_128 = 0x10;
          uStack_126 = 0x10;
          uStack_124 = 0x10;
          uStack_122 = 0x10;
          local_1a0._2_2_ = sStack_1be;
          local_1a0._0_2_ = local_1c0;
          local_1a0._4_2_ = sStack_1bc;
          local_1a0._6_2_ = sStack_1ba;
          local_1a0._10_2_ = sStack_1b6;
          local_1a0._8_2_ = sStack_1b8;
          local_1a0._12_2_ = sStack_1b4;
          local_1a0._14_2_ = sStack_1b2;
          local_1a0._18_2_ = sStack_1ae;
          local_1a0._16_2_ = sStack_1b0;
          local_1a0._20_2_ = sStack_1ac;
          local_1a0._22_2_ = sStack_1aa;
          local_1a0._26_2_ = sStack_1a6;
          local_1a0._24_2_ = sStack_1a8;
          local_1a0._28_2_ = sStack_1a4;
          local_1a0._30_2_ = sStack_1a2;
          local_180._2_2_ = iVar39;
          local_180._0_2_ = iVar39;
          local_180._4_2_ = iVar39;
          local_180._6_2_ = iVar39;
          local_180._8_2_ = iVar39;
          local_180._10_2_ = iVar39;
          local_180._12_2_ = iVar39;
          local_180._14_2_ = iVar39;
          local_180._16_2_ = iVar39;
          local_180._18_2_ = iVar39;
          local_180._20_2_ = iVar39;
          local_180._22_2_ = iVar39;
          local_180._24_2_ = iVar39;
          local_180._26_2_ = iVar39;
          local_180._28_2_ = iVar39;
          local_180._30_2_ = iVar39;
          auVar48 = ZEXT3264(local_180);
          piVar3 = matrix->matrix;
          local_2d8 = uVar27 * 4 + -4;
          local_348 = uVar27 * 8 + -8;
          local_2e0 = 0;
          uVar33 = 0;
          do {
            if (matrix->type == 0) {
              uVar36 = (uint)local_380[uVar33];
              local_3d0 = (uint)local_380[uVar33 + 1];
              local_3d8 = (uint)local_380[uVar33 + 2];
              uVar31 = (uint)local_380[uVar33 + 3];
              local_3b8 = (uint)local_380[uVar33 + 4];
              uVar34 = (uint)local_380[uVar33 + 5];
              local_3e0 = (uint)local_380[uVar33 + 6];
              uVar37 = (uint)local_380[uVar33 + 7];
              local_3c0 = (uint)local_380[uVar33 + 8];
              uVar35 = (uint)local_380[uVar33 + 9];
              local_3c8 = (uint)local_380[uVar33 + 10];
              uVar23 = (uint)local_380[uVar33 + 0xb];
              local_390 = (uint)local_380[uVar33 + 0xc];
              uVar30 = (uint)local_380[uVar33 + 0xd];
              local_398 = (uint)local_380[uVar33 + 0xe];
              local_3a0 = (int)local_380[uVar33 + 0xf];
            }
            else {
              uVar36 = (uint)uVar33;
              local_3d0 = uVar36 | 1;
              if (uVar26 <= (uVar33 | 1)) {
                local_3d0 = uVar18;
              }
              local_3d8 = uVar36 | 2;
              if (uVar26 <= (uVar33 | 2)) {
                local_3d8 = uVar18;
              }
              uVar31 = uVar36 | 3;
              if (uVar26 <= (uVar33 | 3)) {
                uVar31 = uVar18;
              }
              local_3b8 = uVar36 | 4;
              if (uVar26 <= (uVar33 | 4)) {
                local_3b8 = uVar18;
              }
              uVar34 = uVar36 | 5;
              if (uVar26 <= (uVar33 | 5)) {
                uVar34 = uVar18;
              }
              local_3e0 = uVar36 | 6;
              if (uVar26 <= (uVar33 | 6)) {
                local_3e0 = uVar18;
              }
              uVar37 = uVar36 | 7;
              if (uVar26 <= (uVar33 | 7)) {
                uVar37 = uVar18;
              }
              local_3c0 = uVar36 | 8;
              if (uVar26 <= (uVar33 | 8)) {
                local_3c0 = uVar18;
              }
              uVar35 = uVar36 | 9;
              if (uVar26 <= (uVar33 | 9)) {
                uVar35 = uVar18;
              }
              local_3c8 = uVar36 | 10;
              if (uVar26 <= (uVar33 | 10)) {
                local_3c8 = uVar18;
              }
              uVar23 = uVar36 | 0xb;
              if (uVar26 <= (uVar33 | 0xb)) {
                uVar23 = uVar18;
              }
              local_390 = uVar36 | 0xc;
              if (uVar26 <= (uVar33 | 0xc)) {
                local_390 = uVar18;
              }
              uVar30 = uVar36 | 0xd;
              if (uVar26 <= (uVar33 | 0xd)) {
                uVar30 = uVar18;
              }
              local_398 = uVar36 | 0xe;
              if (uVar26 <= (uVar33 | 0xe)) {
                local_398 = uVar18;
              }
              local_3a0 = uVar36 | 0xf;
              if (uVar26 <= (uVar33 | 0xf)) {
                local_3a0 = uVar18;
              }
            }
            iVar20 = matrix->size;
            auVar8._2_2_ = uStack_11e;
            auVar8._0_2_ = local_120;
            auVar8._4_2_ = uStack_11c;
            auVar8._6_2_ = uStack_11a;
            auVar8._8_2_ = uStack_118;
            auVar8._10_2_ = uStack_116;
            auVar8._12_2_ = uStack_114;
            auVar8._14_2_ = uStack_112;
            auVar8._16_2_ = uStack_110;
            auVar8._18_2_ = uStack_10e;
            auVar8._20_2_ = uStack_10c;
            auVar8._22_2_ = uStack_10a;
            auVar8._24_2_ = uStack_108;
            auVar8._26_2_ = uStack_106;
            auVar8._28_2_ = uStack_104;
            auVar8._30_2_ = uStack_102;
            auVar8 = vpcmpgtw_avx2(auVar8,local_220);
            auVar10 = vpmovsxbw_avx2(_DAT_0090923c);
            auVar11._2_2_ = iVar39;
            auVar11._0_2_ = iVar39;
            auVar11._4_2_ = iVar39;
            auVar11._6_2_ = iVar39;
            auVar11._8_2_ = iVar39;
            auVar11._10_2_ = iVar39;
            auVar11._12_2_ = iVar39;
            auVar11._14_2_ = iVar39;
            auVar11._16_2_ = iVar39;
            auVar11._18_2_ = iVar39;
            auVar11._20_2_ = iVar39;
            auVar11._22_2_ = iVar39;
            auVar11._24_2_ = iVar39;
            auVar11._26_2_ = iVar39;
            auVar11._28_2_ = iVar39;
            auVar11._30_2_ = iVar39;
            uVar38 = 0;
            auVar44 = auVar11;
            auVar40 = local_100;
            auVar12 = local_100;
            do {
              auVar49 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(uVar37 * iVar20) +
                                                         (long)*(short *)(ptr[1] + uVar38 * 2)]),
                                    (uint)*(ushort *)
                                           (piVar3 + (long)(int)(local_3e0 * iVar20) +
                                                     (long)*(short *)(ptr[1] + uVar38 * 2 + 2)),1);
              auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar34 * iVar20) +
                                                             (long)*(short *)(ptr[1] + uVar38 * 2 +
                                                                                       4)),2);
              auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_3b8 * iVar20) +
                                                             (long)*(short *)(ptr[1] + uVar38 * 2 +
                                                                                       6)),3);
              auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar31 * iVar20) +
                                                             (long)*(short *)(ptr[1] + uVar38 * 2 +
                                                                                       8)),4);
              auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_3d8 * iVar20) +
                                                             (long)*(short *)(ptr[1] + uVar38 * 2 +
                                                                                       10)),5);
              auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_3d0 * iVar20) +
                                                             (long)*(short *)(ptr[1] + uVar38 * 2 +
                                                                                       0xc)),6);
              auVar49 = vpinsrw_avx(auVar49,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar36 * iVar20) +
                                                             (long)*(short *)(ptr[1] + uVar38 * 2 +
                                                                                       0xe)),7);
              auVar50 = vpinsrw_avx(ZEXT416((uint)piVar3[(long)(int)(local_3a0 * iVar20) +
                                                         (long)*(short *)(*ptr + uVar38 * 2)]),
                                    (uint)*(ushort *)
                                           (piVar3 + (long)(int)(local_398 * iVar20) +
                                                     (long)*(short *)(*ptr + uVar38 * 2 + 2)),1);
              auVar50 = vpinsrw_avx(auVar50,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar30 * iVar20) +
                                                             (long)*(short *)(*ptr + uVar38 * 2 + 4)
                                                   ),2);
              auVar50 = vpinsrw_avx(auVar50,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_390 * iVar20) +
                                                             (long)*(short *)(*ptr + uVar38 * 2 + 6)
                                                   ),3);
              auVar50 = vpinsrw_avx(auVar50,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar23 * iVar20) +
                                                             (long)*(short *)(*ptr + uVar38 * 2 + 8)
                                                   ),4);
              auVar50 = vpinsrw_avx(auVar50,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_3c8 * iVar20) +
                                                             (long)*(short *)(*ptr + uVar38 * 2 + 10
                                                                             )),5);
              auVar50 = vpinsrw_avx(auVar50,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(uVar35 * iVar20) +
                                                             (long)*(short *)(*ptr + uVar38 * 2 +
                                                                                     0xc)),6);
              auVar50 = vpinsrw_avx(auVar50,(uint)*(ushort *)
                                                   (piVar3 + (long)(int)(local_3c0 * iVar20) +
                                                             (long)*(short *)(*ptr + uVar38 * 2 +
                                                                                     0xe)),7);
              iVar1 = ptr_00[uVar38 + 0xf];
              auVar51._2_2_ = iVar1;
              auVar51._0_2_ = iVar1;
              auVar51._4_2_ = iVar1;
              auVar51._6_2_ = iVar1;
              auVar51._8_2_ = iVar1;
              auVar51._10_2_ = iVar1;
              auVar51._12_2_ = iVar1;
              auVar51._14_2_ = iVar1;
              auVar51._16_2_ = iVar1;
              auVar51._18_2_ = iVar1;
              auVar51._20_2_ = iVar1;
              auVar51._22_2_ = iVar1;
              auVar51._24_2_ = iVar1;
              auVar51._26_2_ = iVar1;
              auVar51._28_2_ = iVar1;
              auVar51._30_2_ = iVar1;
              auVar46._0_16_ = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar50;
              auVar46._16_16_ = ZEXT116(1) * auVar49;
              auVar47 = vpalignr_avx2(ZEXT1632(auVar40._16_16_),auVar40,2);
              auVar7 = vpblendw_avx2(auVar47,auVar51,0x80);
              auVar46 = vpaddsw_avx2(auVar12,auVar46);
              auVar12 = vpblendd_avx2(auVar47,auVar7,0xf0);
              iVar1 = ptr_01[uVar38 + 0xf];
              auVar47._2_2_ = iVar1;
              auVar47._0_2_ = iVar1;
              auVar47._4_2_ = iVar1;
              auVar47._6_2_ = iVar1;
              auVar47._8_2_ = iVar1;
              auVar47._10_2_ = iVar1;
              auVar47._12_2_ = iVar1;
              auVar47._14_2_ = iVar1;
              auVar47._16_2_ = iVar1;
              auVar47._18_2_ = iVar1;
              auVar47._20_2_ = iVar1;
              auVar47._22_2_ = iVar1;
              auVar47._24_2_ = iVar1;
              auVar47._26_2_ = iVar1;
              auVar47._28_2_ = iVar1;
              auVar47._30_2_ = iVar1;
              auVar44 = vpalignr_avx2(ZEXT1632(auVar44._16_16_),auVar44,2);
              auVar47 = vpblendw_avx2(auVar44,auVar47,0x80);
              auVar47 = vpblendd_avx2(auVar44,auVar47,0xf0);
              auVar41._2_2_ = uStack_7e;
              auVar41._0_2_ = local_80;
              auVar41._4_2_ = uStack_7c;
              auVar41._6_2_ = uStack_7a;
              auVar41._8_2_ = uStack_78;
              auVar41._10_2_ = uStack_76;
              auVar41._12_2_ = uStack_74;
              auVar41._14_2_ = uStack_72;
              auVar41._16_2_ = uStack_70;
              auVar41._18_2_ = uStack_6e;
              auVar41._20_2_ = uStack_6c;
              auVar41._22_2_ = uStack_6a;
              auVar41._24_2_ = uStack_68;
              auVar41._26_2_ = uStack_66;
              auVar41._28_2_ = uStack_64;
              auVar41._30_2_ = uStack_62;
              auVar44 = vpsubsw_avx2(auVar12,auVar41);
              auVar7._2_2_ = uStack_9e;
              auVar7._0_2_ = local_a0;
              auVar7._4_2_ = uStack_9c;
              auVar7._6_2_ = uStack_9a;
              auVar7._8_2_ = uStack_98;
              auVar7._10_2_ = uStack_96;
              auVar7._12_2_ = uStack_94;
              auVar7._14_2_ = uStack_92;
              auVar7._16_2_ = uStack_90;
              auVar7._18_2_ = uStack_8e;
              auVar7._20_2_ = uStack_8c;
              auVar7._22_2_ = uStack_8a;
              auVar7._24_2_ = uStack_88;
              auVar7._26_2_ = uStack_86;
              auVar7._28_2_ = uStack_84;
              auVar7._30_2_ = uStack_82;
              auVar47 = vpsubsw_avx2(auVar47,auVar7);
              auVar44 = vpmaxsw_avx2(auVar44,auVar47);
              auVar40 = vpsubsw_avx2(auVar40,auVar41);
              auVar11 = vpsubsw_avx2(auVar11,auVar7);
              auVar47 = vpmaxsw_avx2(auVar40,auVar11);
              auVar40 = vpmaxsw_avx2(auVar47,auVar44);
              auVar40 = vpmaxsw_avx2(auVar40,_DAT_00908c40);
              auVar46 = vpmaxsw_avx2(auVar46,auVar40);
              auVar11 = vpcmpeqw_avx2(auVar10,_DAT_00909280);
              auVar40 = vpandn_avx2(auVar11,auVar46);
              if (0xf < uVar38) {
                local_1a0 = vpminsw_avx2(auVar40,local_1a0);
                local_180 = vpmaxsw_avx2(auVar40,local_180);
              }
              piVar4 = ((ppVar21->field_4).rowcols)->score_row;
              auVar49 = auVar40._0_16_;
              auVar50 = auVar40._16_16_;
              if (uVar38 < uVar27) {
                uVar32 = vpextrw_avx(auVar50,7);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_2e0) = uVar32;
              }
              if (uVar38 - 1 < uVar27 && (uVar33 | 1) < uVar26) {
                uVar32 = vpextrw_avx(auVar50,6);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_2d8) = uVar32;
              }
              if (((uVar33 | 2) < uVar26) && ((long)(uVar38 - 2) < (long)uVar27 && 1 < uVar38)) {
                uVar32 = vpextrw_avx(auVar50,5);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_348) = uVar32;
              }
              if (((uVar33 | 3) < uVar26) && ((long)(uVar38 - 3) < (long)uVar27 && 2 < uVar38)) {
                uVar32 = vpextrw_avx(auVar50,4);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_300) = uVar32;
              }
              if (((uVar33 | 4) < uVar26) && ((long)(uVar38 - 4) < (long)uVar27 && 3 < uVar38)) {
                uVar32 = vpextrw_avx(auVar50,3);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_340) = uVar32;
              }
              if (((uVar33 | 5) < uVar26) && ((long)(uVar38 - 5) < (long)uVar27 && 4 < uVar38)) {
                uVar32 = vpextrw_avx(auVar50,2);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_338) = uVar32;
              }
              if (((uVar33 | 6) < uVar26) && ((long)(uVar38 - 6) < (long)uVar27 && 5 < uVar38)) {
                uVar32 = vpextrw_avx(auVar50,1);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_2f8) = uVar32;
              }
              if (((uVar33 | 7) < uVar26) && ((long)(uVar38 - 7) < (long)uVar27 && 6 < uVar38)) {
                uVar32 = vpextrw_avx(auVar50,0);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_328) = uVar32;
              }
              if (((uVar33 | 8) < uVar26) && ((long)(uVar38 - 8) < (long)uVar27 && 7 < uVar38)) {
                uVar32 = vpextrw_avx(auVar49,7);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_318) = uVar32;
              }
              if (((uVar33 | 9) < uVar26) && ((long)(uVar38 - 9) < (long)uVar27 && 8 < uVar38)) {
                uVar32 = vpextrw_avx(auVar49,6);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_320) = uVar32;
              }
              if (((uVar33 | 10) < uVar26) && ((long)(uVar38 - 10) < (long)uVar27 && 9 < uVar38)) {
                uVar32 = vpextrw_avx(auVar49,5);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_330) = uVar32;
              }
              if (((uVar33 | 0xb) < uVar26) && ((long)(uVar38 - 0xb) < (long)uVar27 && 10 < uVar38))
              {
                uVar32 = vpextrw_avx(auVar49,4);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_310) = uVar32;
              }
              if (((uVar33 | 0xc) < uVar26) && ((long)(uVar38 - 0xc) < (long)uVar27 && 0xb < uVar38)
                 ) {
                uVar32 = vpextrw_avx(auVar49,3);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_308) = uVar32;
              }
              if (((uVar33 | 0xd) < uVar26) && ((long)(uVar38 - 0xd) < (long)uVar27 && 0xc < uVar38)
                 ) {
                uVar32 = vpextrw_avx(auVar49,2);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_2f0) = uVar32;
              }
              if (((uVar33 | 0xe) < uVar26) && ((long)(uVar38 - 0xe) < (long)uVar27 && 0xd < uVar38)
                 ) {
                uVar32 = vpextrw_avx(auVar49,1);
                *(undefined4 *)((long)piVar4 + uVar38 * 4 + local_2e8) = uVar32;
              }
              auVar9._2_2_ = iVar39;
              auVar9._0_2_ = iVar39;
              auVar9._4_2_ = iVar39;
              auVar9._6_2_ = iVar39;
              auVar9._8_2_ = iVar39;
              auVar9._10_2_ = iVar39;
              auVar9._12_2_ = iVar39;
              auVar9._14_2_ = iVar39;
              auVar9._16_2_ = iVar39;
              auVar9._18_2_ = iVar39;
              auVar9._20_2_ = iVar39;
              auVar9._22_2_ = iVar39;
              auVar9._24_2_ = iVar39;
              auVar9._26_2_ = iVar39;
              auVar9._28_2_ = iVar39;
              auVar9._30_2_ = iVar39;
              auVar44 = vpblendvb_avx2(auVar44,auVar9,auVar11);
              if (0xe < uVar38 && (uVar33 | 0xf) < uVar26) {
                *(uint *)((long)piVar4 + uVar38 * 4 + local_2d0) = auVar40._0_4_ & 0xffff;
              }
              auVar16._2_2_ = uStack_be;
              auVar16._0_2_ = local_c0;
              auVar16._4_2_ = uStack_bc;
              auVar16._6_2_ = uStack_ba;
              auVar16._8_2_ = uStack_b8;
              auVar16._10_2_ = uStack_b6;
              auVar16._12_2_ = uStack_b4;
              auVar16._14_2_ = uStack_b2;
              auVar16._16_2_ = uStack_b0;
              auVar16._18_2_ = uStack_ae;
              auVar16._20_2_ = uStack_ac;
              auVar16._22_2_ = uStack_aa;
              auVar16._24_2_ = uStack_a8;
              auVar16._26_2_ = uStack_a6;
              auVar16._28_2_ = uStack_a4;
              auVar16._30_2_ = uStack_a2;
              auVar7 = vpcmpgtw_avx2(auVar16,auVar10);
              auVar7 = vpand_avx2(auVar8,auVar7);
              auVar41 = vpsraw_avx2(auVar10,0xf);
              auVar41 = vpandn_avx2(auVar41,auVar7);
              auVar49 = vpacksswb_avx(auVar41._0_16_,auVar41._16_16_);
              auVar43 = auVar45._0_32_;
              auVar51 = vpcmpeqw_avx2(auVar40,auVar43);
              auVar9 = vpcmpgtw_avx2(auVar40,auVar43);
              auVar7 = vpand_avx2(auVar9,auVar41);
              local_160 = vpblendvb_avx2(auVar43,auVar46,auVar7);
              auVar45 = ZEXT3264(local_160);
              auVar50 = vpacksswb_avx(auVar7._0_16_,auVar7._16_16_);
              auVar46 = vpcmpgtw_avx2(auVar42._0_32_,auVar10);
              auVar46 = vpand_avx2(auVar46,auVar51);
              auVar6 = vpacksswb_avx(auVar46._0_16_,auVar46._16_16_);
              auVar49 = vpblendvb_avx(auVar50,auVar49,auVar6);
              auVar43._2_2_ = iVar39;
              auVar43._0_2_ = iVar39;
              auVar43._4_2_ = iVar39;
              auVar43._6_2_ = iVar39;
              auVar43._8_2_ = iVar39;
              auVar43._10_2_ = iVar39;
              auVar43._12_2_ = iVar39;
              auVar43._14_2_ = iVar39;
              auVar43._16_2_ = iVar39;
              auVar43._18_2_ = iVar39;
              auVar43._20_2_ = iVar39;
              auVar43._22_2_ = iVar39;
              auVar43._24_2_ = iVar39;
              auVar43._26_2_ = iVar39;
              auVar43._28_2_ = iVar39;
              auVar43._30_2_ = iVar39;
              auVar11 = vpblendvb_avx2(auVar47,auVar43,auVar11);
              auVar47 = vpmovsxbw_avx2(auVar49);
              local_1e0 = vpblendvb_avx2(auVar48._0_32_,local_220,auVar47);
              auVar48 = ZEXT3264(local_1e0);
              auVar46 = vpor_avx2(auVar9,auVar46);
              auVar46 = vpand_avx2(auVar41,auVar46);
              local_200 = vpblendvb_avx2(auVar42._0_32_,auVar10,auVar46);
              auVar42 = ZEXT3264(local_200);
              ptr_00[uVar38] = auVar40._0_2_;
              vpextrw_avx(auVar44._0_16_,0);
              auVar15._8_2_ = 1;
              auVar15._0_8_ = 0x1000100010001;
              auVar15._10_2_ = 1;
              auVar15._12_2_ = 1;
              auVar15._14_2_ = 1;
              auVar15._16_2_ = 1;
              auVar15._18_2_ = 1;
              auVar15._20_2_ = 1;
              auVar15._22_2_ = 1;
              auVar15._24_2_ = 1;
              auVar15._26_2_ = 1;
              auVar15._28_2_ = 1;
              auVar15._30_2_ = 1;
              auVar10 = vpaddsw_avx2(auVar10,auVar15);
              uVar38 = uVar38 + 1;
            } while (uVar25 != uVar38);
            auVar12._8_2_ = 0x10;
            auVar12._0_8_ = 0x10001000100010;
            auVar12._10_2_ = 0x10;
            auVar12._12_2_ = 0x10;
            auVar12._14_2_ = 0x10;
            auVar12._16_2_ = 0x10;
            auVar12._18_2_ = 0x10;
            auVar12._20_2_ = 0x10;
            auVar12._22_2_ = 0x10;
            auVar12._24_2_ = 0x10;
            auVar12._26_2_ = 0x10;
            auVar12._28_2_ = 0x10;
            auVar12._30_2_ = 0x10;
            local_220 = vpaddsw_avx2(local_220,auVar12);
            uVar33 = uVar33 + 0x10;
            local_2d0 = local_2d0 + lVar22;
            local_2e0 = local_2e0 + lVar22;
            local_2d8 = local_2d8 + lVar22;
            local_2e8 = local_2e8 + lVar22;
            local_2f0 = local_2f0 + lVar22;
            local_308 = local_308 + lVar22;
            local_310 = local_310 + lVar22;
            local_330 = local_330 + lVar22;
            local_320 = local_320 + lVar22;
            local_318 = local_318 + lVar22;
            local_328 = local_328 + lVar22;
            local_2f8 = local_2f8 + lVar22;
            local_338 = local_338 + lVar22;
            local_340 = local_340 + lVar22;
            local_300 = local_300 + lVar22;
            local_348 = local_348 + lVar22;
          } while (uVar33 < uVar26);
          auVar40 = local_180;
          auVar44 = local_1a0;
        }
        lVar22 = 0;
        iVar19 = 0;
        iVar20 = 0;
        iVar24 = 0;
        do {
          uVar2 = *(ushort *)(local_160 + lVar22 * 2);
          if ((short)(ushort)uVar28 < (short)uVar2) {
            uVar28 = (uint)uVar2;
            iVar20 = (int)*(short *)(local_1e0 + lVar22 * 2);
            iVar24 = (int)*(short *)(local_200 + lVar22 * 2);
            iVar19 = (int)*(short *)(local_1e0 + lVar22 * 2);
          }
          else if (uVar2 == (ushort)uVar28) {
            iVar29 = (int)*(short *)(local_200 + lVar22 * 2);
            if (iVar29 < iVar24) {
              iVar20 = (int)*(short *)(local_1e0 + lVar22 * 2);
              iVar24 = iVar29;
              iVar19 = (int)*(short *)(local_1e0 + lVar22 * 2);
            }
            else if ((iVar24 == iVar29) &&
                    (iVar29 = (int)*(short *)(local_1e0 + lVar22 * 2), bVar5 = iVar29 <= iVar20,
                    iVar20 = iVar19, bVar5)) {
              iVar20 = iVar29;
              iVar19 = iVar29;
            }
          }
          sVar17 = (short)uVar28;
          lVar22 = lVar22 + 1;
        } while ((int)lVar22 != 0x10);
        auVar13._2_2_ = iVar39;
        auVar13._0_2_ = iVar39;
        auVar13._4_2_ = iVar39;
        auVar13._6_2_ = iVar39;
        auVar13._8_2_ = iVar39;
        auVar13._10_2_ = iVar39;
        auVar13._12_2_ = iVar39;
        auVar13._14_2_ = iVar39;
        auVar13._16_2_ = iVar39;
        auVar13._18_2_ = iVar39;
        auVar13._20_2_ = iVar39;
        auVar13._22_2_ = iVar39;
        auVar13._24_2_ = iVar39;
        auVar13._26_2_ = iVar39;
        auVar13._28_2_ = iVar39;
        auVar13._30_2_ = iVar39;
        auVar10 = vpcmpgtw_avx2(auVar13,auVar44);
        auVar14._2_2_ = sStack_1be;
        auVar14._0_2_ = local_1c0;
        auVar14._4_2_ = sStack_1bc;
        auVar14._6_2_ = sStack_1ba;
        auVar14._8_2_ = sStack_1b8;
        auVar14._10_2_ = sStack_1b6;
        auVar14._12_2_ = sStack_1b4;
        auVar14._14_2_ = sStack_1b2;
        auVar14._16_2_ = sStack_1b0;
        auVar14._18_2_ = sStack_1ae;
        auVar14._20_2_ = sStack_1ac;
        auVar14._22_2_ = sStack_1aa;
        auVar14._24_2_ = sStack_1a8;
        auVar14._26_2_ = sStack_1a6;
        auVar14._28_2_ = sStack_1a4;
        auVar14._30_2_ = sStack_1a2;
        auVar40 = vpcmpgtw_avx2(auVar40,auVar14);
        auVar10 = vpor_avx2(auVar10,auVar40);
        if ((((((((((((((((((((((((((((((((auVar10 >> 7 & (undefined1  [32])0x1) !=
                                          (undefined1  [32])0x0 ||
                                         (auVar10 >> 0xf & (undefined1  [32])0x1) !=
                                         (undefined1  [32])0x0) ||
                                        (auVar10 >> 0x17 & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0) ||
                                       (auVar10 >> 0x1f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar10 >> 0x27 & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) ||
                                     (auVar10 >> 0x2f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0) ||
                                    (auVar10 >> 0x37 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                   (auVar10 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar10 >> 0x47 & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                  ) || (auVar10 >> 0x4f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                (auVar10 >> 0x57 & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || (auVar10 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar10 >> 0x67 & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                             (auVar10 >> 0x6f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar10 >> 0x77 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar10 >> 0x7f,0) != '\0') ||
                          (auVar10 >> 0x87 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar10 >> 0x8f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar10 >> 0x97 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar10 >> 0x9f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar10 >> 0xa7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     (auVar10 >> 0xaf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar10 >> 0xb7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar10 >> 0xbf,0) != '\0') ||
                  (auVar10 >> 199 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 (auVar10 >> 0xcf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar10 >> 0xd7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar10 >> 0xdf & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar10 >> 0xe7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             (auVar10 >> 0xef & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar10 >> 0xf7 & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            auVar10[0x1f] < '\0') {
          *(byte *)&ppVar21->flag = (byte)ppVar21->flag | 0x40;
          sVar17 = 0;
          iVar24 = 0;
          iVar20 = 0;
        }
        ppVar21->score = (int)sVar17;
        ppVar21->end_query = iVar20;
        ppVar21->end_ref = iVar24;
        parasail_free(ptr_01);
        parasail_free(ptr_00);
        parasail_free(ptr);
        if (matrix->type == 0) {
          parasail_free(local_380);
          return ppVar21;
        }
        return ppVar21;
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int16_t * restrict s1 = NULL;
    int16_t * restrict s2B = NULL;
    int16_t * restrict _H_pr = NULL;
    int16_t * restrict _F_pr = NULL;
    int16_t * restrict s2 = NULL;
    int16_t * restrict H_pr = NULL;
    int16_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 16; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi16(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 2); /* shift in a 0 */
    vOpen = _mm256_set1_epi16(open);
    vGap  = _mm256_set1_epi16(gap);
    vZero = _mm256_set1_epi16(0);
    vOne = _mm256_set1_epi16(1);
    vN = _mm256_set1_epi16(N);
    vNegOne = _mm256_set1_epi16(-1);
    vI = _mm256_set_epi16(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15);
    vJreset = _mm256_set_epi16(0,-1,-2,-3,-4,-5,-6,-7,-8,-9,-10,-11,-12,-13,-14,-15);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi16(s1Len);
    vJLimit = _mm256_set1_epi16(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int16_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int16_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int16_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        const int * const restrict matrow4 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+4] : ((i+4 >= s1Len) ? s1Len-1 : i+4))];
        const int * const restrict matrow5 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+5] : ((i+5 >= s1Len) ? s1Len-1 : i+5))];
        const int * const restrict matrow6 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+6] : ((i+6 >= s1Len) ? s1Len-1 : i+6))];
        const int * const restrict matrow7 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+7] : ((i+7 >= s1Len) ? s1Len-1 : i+7))];
        const int * const restrict matrow8 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+8] : ((i+8 >= s1Len) ? s1Len-1 : i+8))];
        const int * const restrict matrow9 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+9] : ((i+9 >= s1Len) ? s1Len-1 : i+9))];
        const int * const restrict matrow10 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+10] : ((i+10 >= s1Len) ? s1Len-1 : i+10))];
        const int * const restrict matrow11 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+11] : ((i+11 >= s1Len) ? s1Len-1 : i+11))];
        const int * const restrict matrow12 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+12] : ((i+12 >= s1Len) ? s1Len-1 : i+12))];
        const int * const restrict matrow13 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+13] : ((i+13 >= s1Len) ? s1Len-1 : i+13))];
        const int * const restrict matrow14 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+14] : ((i+14 >= s1Len) ? s1Len-1 : i+14))];
        const int * const restrict matrow15 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+15] : ((i+15 >= s1Len) ? s1Len-1 : i+15))];
        __m256i vIltLimit = _mm256_cmplt_epi16_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 2);
            vNH = _mm256_insert_epi16_rpl(vNH, H_pr[j], 15);
            vF = _mm256_srli_si256_rpl(vF, 2);
            vF = _mm256_insert_epi16_rpl(vF, F_pr[j], 15);
            vF = _mm256_max_epi16(
                    _mm256_subs_epi16(vNH, vOpen),
                    _mm256_subs_epi16(vF, vGap));
            vE = _mm256_max_epi16(
                    _mm256_subs_epi16(vWH, vOpen),
                    _mm256_subs_epi16(vE, vGap));
            vMat = _mm256_set_epi16(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]],
                    matrow4[s2[j-4]],
                    matrow5[s2[j-5]],
                    matrow6[s2[j-6]],
                    matrow7[s2[j-7]],
                    matrow8[s2[j-8]],
                    matrow9[s2[j-9]],
                    matrow10[s2[j-10]],
                    matrow11[s2[j-11]],
                    matrow12[s2[j-12]],
                    matrow13[s2[j-13]],
                    matrow14[s2[j-14]],
                    matrow15[s2[j-15]]
                    );
            vNWH = _mm256_adds_epi16(vNWH, vMat);
            vWH = _mm256_max_epi16(vNWH, vE);
            vWH = _mm256_max_epi16(vWH, vF);
            vWH = _mm256_max_epi16(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi16(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi16(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi16(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vWH,0);
            F_pr[j-15] = (int16_t)_mm256_extract_epi16_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi16(vJ, vNegOne),
                        _mm256_cmplt_epi16_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi16(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi16(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi16_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_adds_epi16(vJ, vOne);
        }
        vI = _mm256_adds_epi16(vI, vN);
    }

    /* alignment ending position */
    {
        int16_t *t = (int16_t*)&vMaxH;
        int16_t *i = (int16_t*)&vEndI;
        int16_t *j = (int16_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi16_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}